

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall
CTcParser::parse_obj_template(CTcParser *this,int *err,CTPNObjDef *objdef,int is_inline)

{
  CTcSymProp *pCVar1;
  CTcSymProp *pCVar2;
  tc_toktyp_t tVar3;
  CTcTokFileDesc *pCVar4;
  long lVar5;
  CTcToken *pCVar6;
  CTcSymProp *pCVar7;
  CTcObjTemplateInst *src;
  CTPNObjDef *in_RDX;
  size_t in_RDI;
  int undesc_class;
  CTPNSuperclass *def_sc;
  CTcObjTemplate *tpl;
  CTcPrsPropExprSave save_info;
  int done;
  CTcObjTemplateInst *p;
  size_t cnt;
  int in_stack_ffffffffffffff1c;
  CTcParser *in_stack_ffffffffffffff20;
  CTcTokenizer *in_stack_ffffffffffffff28;
  CTcTokenizer **in_stack_ffffffffffffff30;
  CTcTokenizer *in_stack_ffffffffffffff38;
  int replace;
  undefined4 in_stack_ffffffffffffff50;
  CTcParser *pCVar8;
  CTPNObjDef *this_00;
  CTcObjTemplateInst *in_stack_ffffffffffffff68;
  CTPNSuperclass *in_stack_ffffffffffffff70;
  CTcParser *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffffac;
  CTPNAnonFunc **in_stack_ffffffffffffffb0;
  CTPNCodeBody **in_stack_ffffffffffffffb8;
  CTcPrsNode **in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar9;
  long *plVar10;
  long local_28;
  int in_stack_ffffffffffffffe0;
  
  tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x2bf7d2);
  src = (CTcObjTemplateInst *)(ulong)(tVar3 - TOKT_SSTR);
  switch(src) {
  case (CTcObjTemplateInst *)0x0:
  case (CTcObjTemplateInst *)0x1:
  case (CTcObjTemplateInst *)0x4:
  case (CTcObjTemplateInst *)0x5:
  case (CTcObjTemplateInst *)0xb:
  case (CTcObjTemplateInst *)0xf:
  case (CTcObjTemplateInst *)0x14:
  case (CTcObjTemplateInst *)0x15:
  case (CTcObjTemplateInst *)0x16:
  case (CTcObjTemplateInst *)0x17:
  case (CTcObjTemplateInst *)0x18:
  case (CTcObjTemplateInst *)0x1e:
  case (CTcObjTemplateInst *)0x21:
  case (CTcObjTemplateInst *)0x36:
  case (CTcObjTemplateInst *)0x37:
  case (CTcObjTemplateInst *)0x41:
    local_28 = 0;
    pCVar8 = *(CTcParser **)(in_RDI + 0x1b8);
    iVar9 = 0;
    while (iVar9 == 0) {
      in_stack_ffffffffffffff30 = &G_tok;
      pCVar4 = CTcTokenizer::get_last_desc(G_tok);
      *(CTcTokFileDesc **)(in_RDI + 0x120) = pCVar4;
      lVar5 = CTcTokenizer::get_last_linenum
                        ((CTcTokenizer *)((CTcParser *)in_stack_ffffffffffffff30)->ov_op_add_);
      *(long *)(in_RDI + 0x128) = lVar5;
      tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x2bf88a);
      *(tc_toktyp_t *)&pCVar8->ov_op_div_ = tVar3;
      pCVar6 = CTcTokenizer::copycur(in_stack_ffffffffffffff38);
      *(undefined1 *)&pCVar8->ov_op_lshr_ = pCVar6->field_0x20;
      pCVar7 = *(CTcSymProp **)pCVar6;
      pCVar1 = (CTcSymProp *)pCVar6->text_;
      pCVar2 = (CTcSymProp *)pCVar6->int_val_;
      pCVar8->ov_op_shl_ = (CTcSymProp *)pCVar6->text_len_;
      pCVar8->ov_op_ashr_ = pCVar2;
      pCVar8->ov_op_mod_ = pCVar7;
      pCVar8->ov_op_xor_ = pCVar1;
      pCVar8->ov_op_add_ = (CTcSymProp *)0x0;
      pCVar8->ov_op_sub_ = (CTcSymProp *)0x0;
      pCVar8->ov_op_mul_ = (CTcSymProp *)0x0;
      begin_prop_expr((CTcParser *)in_stack_ffffffffffffff30,
                      (CTcPrsPropExprSave *)in_stack_ffffffffffffff28,
                      (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(int)in_stack_ffffffffffffff20
                     );
      tVar3 = CTcTokenizer::cur((CTcTokenizer *)0x2bf918);
      in_stack_ffffffffffffff38 = (CTcTokenizer *)(ulong)(tVar3 - TOKT_EOF);
      switch(in_stack_ffffffffffffff38) {
      case (CTcTokenizer *)0x0:
        return;
      default:
        iVar9 = 1;
        local_28 = local_28 + -1;
        break;
      case (CTcTokenizer *)0x8:
        pCVar7 = (CTcSymProp *)CTcPrsOpUnary::parse_primary();
        pCVar8->ov_op_add_ = pCVar7;
        break;
      case (CTcTokenizer *)0x9:
        pCVar7 = (CTcSymProp *)CTcPrsOpUnary::parse_primary();
        pCVar8->ov_op_add_ = pCVar7;
        *(undefined4 *)&pCVar8->ov_op_div_ = 10;
        break;
      case (CTcTokenizer *)0xc:
        pCVar7 = (CTcSymProp *)
                 parse_expr_or_dstr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        pCVar8->ov_op_add_ = pCVar7;
        break;
      case (CTcTokenizer *)0xd:
        pCVar7 = (CTcSymProp *)
                 parse_expr_or_dstr(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        pCVar8->ov_op_add_ = pCVar7;
        *(undefined4 *)&pCVar8->ov_op_div_ = 0xe;
        break;
      case (CTcTokenizer *)0x13:
      case (CTcTokenizer *)0x1c:
      case (CTcTokenizer *)0x1d:
      case (CTcTokenizer *)0x1e:
      case (CTcTokenizer *)0x1f:
      case (CTcTokenizer *)0x20:
      case (CTcTokenizer *)0x26:
      case (CTcTokenizer *)0x29:
      case (CTcTokenizer *)0x3e:
      case (CTcTokenizer *)0x3f:
      case (CTcTokenizer *)0x49:
        CTcTokenizer::next(in_stack_ffffffffffffff28);
        pCVar6 = CTcTokenizer::copycur(in_stack_ffffffffffffff38);
        memcpy(&pCVar8->ov_op_mod_,pCVar6,0x21);
        pCVar7 = (CTcSymProp *)CTcPrsOpUnary::parse_primary();
        pCVar8->ov_op_add_ = pCVar7;
        break;
      case (CTcTokenizer *)0x17:
        pCVar7 = (CTcSymProp *)CTcPrsOpUnary::parse_list();
        pCVar8->ov_op_add_ = pCVar7;
      }
      in_stack_ffffffffffffff20 = (CTcParser *)0x0;
      finish_prop_expr(pCVar8,(CTcPrsPropExprSave *)CONCAT44(iVar9,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0
                       ,in_stack_ffffffffffffffac,in_stack_ffffffffffffffe0,(CTcSymProp *)in_RDX);
      if (local_28 + 1U < *(ulong *)(in_RDI + 0x1c0)) {
        pCVar8 = (CTcParser *)&pCVar8->ov_op_bor_;
      }
      local_28 = local_28 + 1;
    }
    this_00 = (CTPNObjDef *)0x0;
    pCVar8 = (CTcParser *)0x0;
    iVar9 = 0;
    if (in_RDX != (CTPNObjDef *)0x0) {
      CTPNObjDef::get_first_sc(in_RDX);
      this_00 = (CTPNObjDef *)
                find_class_template(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                    in_stack_ffffffffffffff68,(size_t)this_00,
                                    (CTPNSuperclass **)pCVar8,
                                    (int *)CONCAT44(iVar9,in_stack_ffffffffffffff50));
      CTPNObjDef::set_undesc_sc(in_RDX,iVar9);
    }
    if ((this_00 == (CTPNObjDef *)0x0) && (iVar9 == 0)) {
      this_00 = (CTPNObjDef *)
                find_template_match((CTcParser *)in_stack_ffffffffffffff38,
                                    (CTcObjTemplate *)in_stack_ffffffffffffff30,
                                    (CTcObjTemplateInst *)in_stack_ffffffffffffff28,
                                    (size_t)in_stack_ffffffffffffff20);
    }
    if (this_00 == (CTPNObjDef *)0x0) {
      if (in_RDX != (CTPNObjDef *)0x0) {
        CTPNObjDef::note_bad_template(in_RDX,1);
      }
    }
    else if (in_RDX != (CTPNObjDef *)0x0) {
      match_template(pCVar8,(CTcObjTemplateItem *)CONCAT44(iVar9,in_stack_ffffffffffffff50),src,
                     in_RDI);
      plVar10 = *(long **)(in_RDI + 0x1b8);
      for (; local_28 != 0; local_28 = local_28 + -1) {
        replace = (int)(in_RDI >> 0x20);
        if (plVar10[1] == 0) {
          if (plVar10[2] == 0) {
            if (*plVar10 != 0) {
              CTPNObjDef::add_prop
                        (this_00,(CTcSymProp *)pCVar8,
                         (CTcPrsNode *)CONCAT44(iVar9,in_stack_ffffffffffffff50),
                         (int)((ulong)src >> 0x20),(int)src);
            }
          }
          else {
            CTPNObjDef::add_inline_method
                      (this_00,(CTcSymProp *)pCVar8,
                       (CTPNAnonFunc *)CONCAT44(iVar9,in_stack_ffffffffffffff50),(CTcPrsNode *)src,
                       replace);
          }
        }
        else {
          CTPNObjDef::add_method
                    (this_00,(CTcSymProp *)pCVar8,
                     (CTPNCodeBody *)CONCAT44(iVar9,in_stack_ffffffffffffff50),(CTcPrsNode *)src,
                     replace);
        }
        plVar10 = plVar10 + 10;
      }
    }
    break;
  default:
  }
  return;
}

Assistant:

void CTcParser::parse_obj_template(int *err, CTPNObjDef *objdef, int is_inline)
{
    /* check the current token for a template use */
    switch(G_tok->cur())
    {
    case TOKT_SSTR:
    case TOKT_SSTR_START:
    case TOKT_DSTR:
    case TOKT_DSTR_START:
    case TOKT_LBRACK:
    case TOKT_AT:
    case TOKT_PLUS:
    case TOKT_MINUS:
    case TOKT_TIMES:
    case TOKT_DIV:
    case TOKT_MOD:
    case TOKT_ARROW:
    case TOKT_AND:
    case TOKT_NOT:
    case TOKT_BNOT:
    case TOKT_COMMA:
        /* we have an object template */
        break;

    default:
        /* it's not a template - simply return without parsing anything */
        return;
    }

    /* parse the expressions until we reach the end of the template */
    size_t cnt;
    CTcObjTemplateInst *p;
    int done;
    CTcPrsPropExprSave save_info;
    for (cnt = 0, p = template_expr_, done = FALSE ; !done ; ++cnt)
    {
        /* 
         *   remember the statment start location, in case we have a
         *   template element that generates code (such as a double-quoted
         *   string with an embedded expression) 
         */
        cur_desc_ = G_tok->get_last_desc();
        cur_linenum_ = G_tok->get_last_linenum();

        /* 
         *   note the token, so that we can figure out which template we
         *   are using 
         */
        p->def_tok_ = G_tok->cur();

        /* assume this will also be the first token of the value expression */
        p->expr_tok_ = *G_tok->copycur();

        /* we don't have any expression yet */
        p->expr_ = 0;
        p->code_body_ = 0;
        p->inline_method_ = 0;

        /* prepare to parse a property value expression */
        begin_prop_expr(&save_info, FALSE, is_inline);

        /* check to see if this is another template item */
        switch(G_tok->cur())
        {
        case TOKT_SSTR:
            /* single-quoted string - parse just the string */
            p->expr_ = CTcPrsOpUnary::parse_primary();
            break;

        case TOKT_SSTR_START:
            /* start of single-quoted embedded expression string - parse it */
            p->expr_ = CTcPrsOpUnary::parse_primary();

            /* treat it as a regular string for template matching */
            p->def_tok_ = TOKT_SSTR;
            break;

        case TOKT_DSTR:
            /* string - parse it */
            p->expr_ = parse_expr_or_dstr(TRUE);
            break;

        case TOKT_DSTR_START:
            /* start of a double-quoted embedded expression string */
            p->expr_ = parse_expr_or_dstr(TRUE);

            /* 
             *   treat it as a regular double-quoted string for the
             *   purposes of matching the template 
             */
            p->def_tok_ = TOKT_DSTR;
            break;
            
        case TOKT_LBRACK:
            /* it's a list */
            p->expr_ = CTcPrsOpUnary::parse_list();
            break;
            
        case TOKT_AT:
        case TOKT_PLUS:
        case TOKT_MINUS:
        case TOKT_TIMES:
        case TOKT_DIV:
        case TOKT_MOD:
        case TOKT_ARROW:
        case TOKT_AND:
        case TOKT_NOT:
        case TOKT_BNOT:
        case TOKT_COMMA:
            /* skip the operator token */
            G_tok->next();

            /* the value expression starts with this token */
            p->expr_tok_ = *G_tok->copycur();

            /* a primary expression must follow */
            p->expr_ = CTcPrsOpUnary::parse_primary();
            break;

        case TOKT_EOF:
            /* end of file - return and let the caller deal with it */
            return;

        default:
            /* anything else ends the template list */
            done = TRUE;

            /* don't count this item after all */
            --cnt;
            break;
        }

        /* 
         *   check for embedded anonymous functions, and wrap the expression
         *   in a code body if necessary 
         */
        finish_prop_expr(
            &save_info, p->expr_, p->code_body_, p->inline_method_,
            FALSE, is_inline, 0);

        /* 
         *   move on to the next expression slot if we have room (if we
         *   don't, we won't match anything anyway; just keep writing over
         *   the last slot so that we can at least keep parsing entries) 
         */
        if (cnt + 1 < template_expr_max_)
            ++p;
    }

    /* we have no matching template yet */
    const CTcObjTemplate *tpl = 0;
    const CTPNSuperclass *def_sc = 0;

    /* presume we don't have any undescribed classes in our hierarchy */
    int undesc_class = FALSE;

    /*
     *   Search for the template, using the normal inheritance rules that we
     *   use at run-time: start with the first superclass and look for a
     *   match; if we find a match, look at subsequent superclasses to look
     *   for one that overrides the match.  
     */
    if (objdef != 0)
    {
        /* search our superclasses for a match */
        tpl = find_class_template(
            objdef->get_first_sc(), template_expr_, cnt,
            &def_sc, &undesc_class);

        /* remember the 'undescribed class' status */
        objdef->set_undesc_sc(undesc_class);
    }

    /* if we didn't find a match, look for a root object match */
    if (tpl == 0 && !undesc_class)
        tpl = find_template_match(template_head_, template_expr_, cnt);

    /* if we didn't find a match, it's an error */
    if (tpl == 0)
    {
        /*
         *   Note the error, but don't report it yet.  It might be that we
         *   failed to find a template match simply because one of our
         *   superclass names was misspelled.  If that's the case, then the
         *   missing template is the least of our problems, and it's not
         *   worth reporting since it's probably just a side effect of the
         *   missing superclass (that is, once the superclass misspelling is
         *   corrected and the code is re-compiled, we might find that the
         *   template is correct after all, since we'll know which class to
         *   scan for the needed template.)  At code generation time, we'll
         *   be able to resolve the superclasses and find out what's really
         *   going on, so that we can flag the appropriate error.  
         */
        if (objdef != 0)
            objdef->note_bad_template(TRUE);
        
        /* ignore the template instance */
        return;
    }

    /* if there's no object statement, there's nothing left to do */
    if (objdef == 0)
        return;

    /* 
     *   we know we have a matching template, so populate our actual
     *   parameter list with the property identifiers for the matching
     *   template 
     */
    match_template(tpl->items_, template_expr_, cnt);

    /* define the property values according to the template */
    for (p = template_expr_ ; cnt != 0 ; ++p, --cnt)
    {
        /* add this property */
        if (p->code_body_ != 0)
            objdef->add_method(p->prop_, p->code_body_, p->expr_, FALSE);
        else if (p->inline_method_ != 0)
            objdef->add_inline_method(
                p->prop_, p->inline_method_, p->expr_, FALSE);
        else if (p->expr_ != 0)
            objdef->add_prop(p->prop_, p->expr_, FALSE, FALSE);
    }
}